

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O0

void __thiscall
fizplex::SimplexTest_LowerRowUpperVarOptimalSolution_Test::TestBody
          (SimplexTest_LowerRowUpperVarOptimalSolution_Test *this)

{
  initializer_list<double> l;
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  double in_stack_000002e0;
  double in_stack_000002e8;
  char *in_stack_000002f0;
  char *in_stack_000002f8;
  double in_stack_ffffffffffffff18;
  Result *in_stack_ffffffffffffff20;
  Result *in_stack_ffffffffffffff28;
  AssertionResult *pAVar3;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  iterator in_stack_ffffffffffffff38;
  size_type in_stack_ffffffffffffff40;
  DVector *row;
  undefined1 *upper;
  AssertHelper in_stack_ffffffffffffff70;
  RowType in_stack_ffffffffffffff7c;
  LP *in_stack_ffffffffffffff80;
  AssertHelper local_70;
  Message local_68;
  undefined4 local_5c;
  AssertionResult local_58 [2];
  _func_int **local_38;
  scoped_ptr<testing::internal::GTestFlagSaver> this_00;
  undefined1 local_20 [32];
  
  row = (DVector *)0xfff0000000000000;
  LP::add_column((LP *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                 (ColType)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                 (double)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,9.33961934272459e-318);
  local_38 = (_func_int **)0xc000000000000000;
  this_00.ptr_ = (GTestFlagSaver *)&local_38;
  upper = local_20;
  l._M_len = in_stack_ffffffffffffff40;
  l._M_array = in_stack_ffffffffffffff38;
  DVector::DVector((DVector *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),l);
  LP::add_row(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
              (double)in_stack_ffffffffffffff70.data_,(double)upper,row);
  DVector::~DVector((DVector *)0x1cd8b9);
  SimplexTest::solve_lp((SimplexTest *)this_00.ptr_);
  local_5c = 1;
  pAVar3 = local_58;
  testing::internal::EqHelper<false>::Compare<fizplex::Simplex::Result,fizplex::Simplex::Result>
            ((char *)in_stack_ffffffffffffff38,
             (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1cd97c);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex_test.cc"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message((Message *)0x1cd9d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cda22);
  pAVar3 = (AssertionResult *)&stack0xffffffffffffff80;
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_000002f8,in_stack_000002f0,in_stack_000002e8,in_stack_000002e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1cdab4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex_test.cc"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff70,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff70);
    testing::Message::~Message((Message *)0x1cdb02);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cdb4e);
  return;
}

Assistant:

TEST_F(SimplexTest, LowerRowUpperVarOptimalSolution) {
  lp.add_column(ColType::UpperBound, -inf, 0.0, 1);
  lp.add_row(RowType::LE, -inf, 14, {-2});

  solve_lp();
  EXPECT_EQ(Simplex::Result::OptimalSolution, result);
  EXPECT_DOUBLE_EQ(-7.0, z);
}